

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O1

void __thiscall
alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::
create_two_new_data_nodes
          (Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
           *this,data_node_type *old_node,model_node_type *parent,int duplication_factor,
          bool reuse_model,int start_bucketID)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  self_type *psVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int pos;
  int iVar9;
  data_node_type *pdVar10;
  data_node_type *pdVar11;
  uint8_t uVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double local_38;
  
  if (duplication_factor < 1) {
    __assert_fail("duplication_factor >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex.h"
                  ,0x69d,
                  "void alex::Alex<double, double>::create_two_new_data_nodes(data_node_type *, model_node_type *, int, bool, int) [T = double, P = double, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<double, double>>, allow_duplicates = true]"
                 );
  }
  iVar13 = 1 << (duplication_factor & 0x1fU);
  iVar6 = iVar13 + start_bucketID;
  iVar16 = iVar13 / 2 + start_bucketID;
  dVar17 = (double)old_node->num_right_out_of_bounds_inserts_ / (double)old_node->num_inserts_;
  local_38 = (parent->super_AlexNode<double,_double>).model_.a_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_38;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = (parent->super_AlexNode<double,_double>).model_.b_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = old_node->max_key_;
  auVar23 = vfmadd213sd_fma(auVar23,auVar18,auVar22);
  uVar15 = parent->num_children_ - 1;
  uVar7 = ~((int)auVar23._0_8_ >> 0x1f) & (int)auVar23._0_8_;
  if ((int)uVar15 < (int)uVar7) {
    uVar7 = uVar15;
  }
  dVar20 = (double)old_node->num_left_out_of_bounds_inserts_ / (double)old_node->num_inserts_;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = old_node->min_key_;
  auVar23 = vfmadd231sd_fma(auVar22,auVar18,auVar2);
  uVar8 = ~((int)auVar23._0_8_ >> 0x1f) & (int)auVar23._0_8_;
  if ((int)uVar8 <= (int)uVar15) {
    uVar15 = uVar8;
  }
  local_38 = ((double)iVar16 - (parent->super_AlexNode<double,_double>).model_.b_) / local_38;
  pos = AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
        ::lower_bound<double>(old_node,&local_38);
  if (pos < old_node->data_capacity_) {
    do {
      dVar1 = old_node->key_slots_[pos];
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar1;
      if (((dVar1 == 1.79769313486232e+308) && (!NAN(dVar1))) ||
         (auVar21._8_8_ = 0, auVar21._0_8_ = (parent->super_AlexNode<double,_double>).model_.a_,
         auVar3._8_8_ = 0, auVar3._0_8_ = (parent->super_AlexNode<double,_double>).model_.b_,
         auVar23 = vfmadd213sd_fma(auVar19,auVar21,auVar3), iVar16 <= (int)auVar23._0_8_)) break;
      iVar9 = AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
              ::get_next_filled_position(old_node,pos,false);
      iVar9 = iVar9 + 1;
      iVar4 = old_node->data_capacity_;
      pos = iVar9;
      if (iVar4 < iVar9) {
        pos = iVar4;
      }
    } while (iVar9 < iVar4);
  }
  pdVar10 = bulk_load_leaf_node_from_existing
                      (this,old_node,0,pos,true,(FTNode *)0x0,reuse_model,
                       (start_bucketID <= (int)uVar7 && (int)uVar7 < iVar16) && 0.9 < dVar17,
                       (start_bucketID <= (int)uVar15 && (int)uVar15 < iVar16) && 0.9 < dVar20);
  pdVar11 = bulk_load_leaf_node_from_existing
                      (this,old_node,pos,old_node->data_capacity_,true,(FTNode *)0x0,reuse_model,
                       (bool)(~(dVar17 <= 0.9 || (int)uVar7 < iVar16) & (int)uVar7 < iVar6),
                       (bool)(~(dVar20 <= 0.9 || (int)uVar15 < iVar16) & (int)uVar15 < iVar6));
  (pdVar10->super_AlexNode<double,_double>).level_ =
       (parent->super_AlexNode<double,_double>).level_ + 1;
  (pdVar11->super_AlexNode<double,_double>).level_ =
       (parent->super_AlexNode<double,_double>).level_ + 1;
  uVar12 = (char)duplication_factor + 0xff;
  (pdVar10->super_AlexNode<double,_double>).duplication_factor_ = uVar12;
  (pdVar11->super_AlexNode<double,_double>).duplication_factor_ = uVar12;
  if (1 < iVar13) {
    lVar14 = (long)start_bucketID;
    do {
      parent->children_[lVar14] = &pdVar10->super_AlexNode<double,_double>;
      lVar14 = lVar14 + 1;
    } while (lVar14 < iVar16);
  }
  if (duplication_factor != 0x1f) {
    lVar14 = (long)iVar16;
    do {
      parent->children_[lVar14] = &pdVar11->super_AlexNode<double,_double>;
      lVar14 = lVar14 + 1;
    } while (lVar14 < iVar6);
  }
  psVar5 = old_node->prev_leaf_;
  if (psVar5 != (self_type *)0x0) {
    psVar5->next_leaf_ = pdVar10;
  }
  pdVar10->prev_leaf_ = psVar5;
  pdVar10->next_leaf_ = pdVar11;
  pdVar11->prev_leaf_ = pdVar10;
  pdVar11->next_leaf_ = old_node->next_leaf_;
  if (old_node->next_leaf_ != (self_type *)0x0) {
    old_node->next_leaf_->prev_leaf_ = pdVar11;
  }
  return;
}

Assistant:

void create_two_new_data_nodes(data_node_type* old_node,
                                 model_node_type* parent,
                                 int duplication_factor, bool reuse_model,
                                 int start_bucketID = 0) {
    assert(duplication_factor >= 1);
    int num_buckets = 1 << duplication_factor;
    int end_bucketID = start_bucketID + num_buckets;
    int mid_bucketID = start_bucketID + num_buckets / 2;

    bool append_mostly_right = old_node->is_append_mostly_right();
    int appending_right_bucketID = std::min<int>(
        std::max<int>(parent->model_.predict(old_node->max_key_), 0),
        parent->num_children_ - 1);
    bool append_mostly_left = old_node->is_append_mostly_left();
    int appending_left_bucketID = std::min<int>(
        std::max<int>(parent->model_.predict(old_node->min_key_), 0),
        parent->num_children_ - 1);

    int right_boundary = old_node->lower_bound(
        (mid_bucketID - parent->model_.b_) / parent->model_.a_);
    // Account for off-by-one errors due to floating-point precision issues.
    while (right_boundary < old_node->data_capacity_ &&
           old_node->get_key(right_boundary) != data_node_type::kEndSentinel_ &&
           parent->model_.predict(old_node->get_key(right_boundary)) <
               mid_bucketID) {
      right_boundary = std::min(
          old_node->get_next_filled_position(right_boundary, false) + 1,
          old_node->data_capacity_);
    }
    data_node_type* left_leaf = bulk_load_leaf_node_from_existing(
        old_node, 0, right_boundary, true, nullptr, reuse_model,
        append_mostly_right && start_bucketID <= appending_right_bucketID &&
            appending_right_bucketID < mid_bucketID,
        append_mostly_left && start_bucketID <= appending_left_bucketID &&
            appending_left_bucketID < mid_bucketID);
    data_node_type* right_leaf = bulk_load_leaf_node_from_existing(
        old_node, right_boundary, old_node->data_capacity_, true, nullptr,
        reuse_model,
        append_mostly_right && mid_bucketID <= appending_right_bucketID &&
            appending_right_bucketID < end_bucketID,
        append_mostly_left && mid_bucketID <= appending_left_bucketID &&
            appending_left_bucketID < end_bucketID);
    left_leaf->level_ = static_cast<short>(parent->level_ + 1);
    right_leaf->level_ = static_cast<short>(parent->level_ + 1);
    left_leaf->duplication_factor_ =
        static_cast<uint8_t>(duplication_factor - 1);
    right_leaf->duplication_factor_ =
        static_cast<uint8_t>(duplication_factor - 1);

    for (int i = start_bucketID; i < mid_bucketID; i++) {
      parent->children_[i] = left_leaf;
    }
    for (int i = mid_bucketID; i < end_bucketID; i++) {
      parent->children_[i] = right_leaf;
    }
    link_data_nodes(old_node, left_leaf, right_leaf);
  }